

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void I_NetCmd(void)

{
  if (doomcom.command == 1) {
    PacketSend();
  }
  else if (doomcom.command == 2) {
    PacketGet();
  }
  else {
    I_Error("Bad net cmd: %i\n",(ulong)(uint)(int)doomcom.command);
  }
  return;
}

Assistant:

void I_NetCmd (void)
{
	if (doomcom.command == CMD_SEND)
	{
		PacketSend ();
	}
	else if (doomcom.command == CMD_GET)
	{
		PacketGet ();
	}
	else
		I_Error ("Bad net cmd: %i\n",doomcom.command);
}